

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  long *plVar1;
  value_type vVar2;
  VersionSet *this_00;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  pointer pbVar6;
  size_type sVar7;
  reference filename;
  size_type sVar8;
  reference puVar9;
  Env *pEVar10;
  reference pvVar11;
  VersionEdit *in_RCX;
  undefined1 local_210 [16];
  size_t i_1;
  iterator local_1f8;
  iterator local_1f0;
  Slice local_1c8;
  Slice local_1b8;
  char local_1a8 [8];
  char buf [50];
  undefined1 local_168 [8];
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  undefined8 uStack_140;
  FileType type;
  uint64_t number;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  uint64_t prev_log;
  uint64_t min_log;
  SequenceNumber max_sequence;
  Slice local_c8;
  Slice local_b8;
  Slice local_a8;
  Slice local_98;
  undefined1 local_88 [8];
  string local_80;
  undefined4 local_5c;
  string local_58;
  Status local_38;
  Status s;
  bool *save_manifest_local;
  VersionEdit *edit_local;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld((Mutex *)&edit[1].log_number_);
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  (**(code **)(*plVar1 + 0x50))
            (&s,plVar1,
             &(edit->new_files_).
              super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  Status::~Status(&s);
  if (*(long *)((long)&edit[1].comparator_.field_2 + 8) != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x128,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName(&local_58,
               (string *)
               &(edit->new_files_).
                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  (**(code **)(*plVar1 + 0x78))
            (&local_38,plVar1,&local_58,(undefined1 *)((long)&edit[1].comparator_.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  bVar4 = Status::ok(&local_38);
  if (!bVar4) {
    Status::Status((Status *)this,&local_38);
    local_5c = 1;
    goto LAB_00119f94;
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  CurrentFileName((string *)(local_88 + 8),
                  (string *)
                  &(edit->new_files_).
                   super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  bVar5 = (**(code **)(*plVar1 + 0x30))(plVar1,local_88 + 8);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  if (((bVar5 ^ 0xff) & 1) == 0) {
    if ((edit->last_sequence_ & 0x100) != 0) {
      Slice::Slice(&local_b8,
                   (string *)
                   &(edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      Slice::Slice(&local_c8,"exists (error_if_exists is true)");
      Status::InvalidArgument((Status *)this,&local_b8,&local_c8);
      local_5c = 1;
      goto LAB_00119f94;
    }
  }
  else {
    if ((edit->last_sequence_ & 1) == 0) {
      Slice::Slice(&local_98,
                   (string *)
                   &(edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      Slice::Slice(&local_a8,"does not exist (create_if_missing is false)");
      Status::InvalidArgument((Status *)this,&local_98,&local_a8);
      local_5c = 1;
      goto LAB_00119f94;
    }
    NewDB((DBImpl *)local_88);
    Status::operator=(&local_38,(Status *)local_88);
    Status::~Status((Status *)local_88);
    bVar4 = Status::ok(&local_38);
    if (!bVar4) {
      Status::Status((Status *)this,&local_38);
      local_5c = 1;
      goto LAB_00119f94;
    }
  }
  VersionSet::Recover((VersionSet *)&max_sequence,(bool *)edit[3].next_file_number_);
  Status::operator=(&local_38,(Status *)&max_sequence);
  Status::~Status((Status *)&max_sequence);
  bVar4 = Status::ok(&local_38);
  if (bVar4) {
    pbVar6 = (pointer)VersionSet::LogNumber((VersionSet *)edit[3].next_file_number_);
    filenames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)VersionSet::PrevLogNumber((VersionSet *)edit[3].next_file_number_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100);
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    (**(code **)(*plVar1 + 0x38))
              (&expected._M_t._M_impl.super__Rb_tree_header._M_node_count,plVar1,
               &(edit->new_files_).
                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,local_100);
    Status::operator=(&local_38,(Status *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
    Status::~Status((Status *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar4 = Status::ok(&local_38);
    if (bVar4) {
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
      VersionSet::AddLiveFiles
                ((VersionSet *)edit[3].next_file_number_,
                 (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      for (local_168 = (undefined1  [8])0x0;
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_100), (ulong)local_168 < sVar7;
          local_168 = (undefined1  [8])((long)local_168 + 1)) {
        filename = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_100,(size_type)local_168);
        bVar4 = ParseFileName(filename,&stack0xfffffffffffffec0,
                              (FileType *)
                              ((long)&logs.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        if (((bVar4) &&
            (std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             erase((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &number,&stack0xfffffffffffffec0),
            logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0)) &&
           ((pbVar6 <= (ulong)uStack_140 ||
            ((pointer)uStack_140 ==
             filenames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage)))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                     &stack0xfffffffffffffec0);
        }
      }
      bVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &number);
      if (bVar4) {
        local_1f8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
        i_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
        std::
        sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_1f8._M_current,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )i_1);
        for (local_210._8_8_ = (Env *)0x0; uVar3 = local_210._8_8_,
            pEVar10 = (Env *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i)
            , (ulong)uVar3 < pEVar10; local_210._8_8_ = (long)(_func_int ***)local_210._8_8_ + 1) {
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                               local_210._8_8_);
          uVar3 = local_210._8_8_;
          vVar2 = *pvVar11;
          sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
          RecoverLogFile((DBImpl *)local_210,(uint64_t)edit,SUB81(vVar2,0),
                         (bool *)(ulong)((Env *)uVar3 == (Env *)(sVar7 - 1)),in_RCX,
                         (SequenceNumber *)save_manifest);
          Status::operator=(&local_38,(Status *)local_210);
          Status::~Status((Status *)local_210);
          bVar4 = Status::ok(&local_38);
          if (!bVar4) {
            Status::Status((Status *)this,&local_38);
            goto LAB_00119f70;
          }
          this_00 = (VersionSet *)edit[3].next_file_number_;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                               local_210._8_8_);
          VersionSet::MarkFileNumberUsed(this_00,*pvVar11);
        }
        VersionSet::LastSequence((VersionSet *)edit[3].next_file_number_);
        Status::OK();
      }
      else {
        sVar8 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&number);
        snprintf(local_1a8,0x32,"%d missing files; e.g.",sVar8 & 0xffffffff);
        Slice::Slice(&local_1b8,local_1a8);
        local_1f0 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&number);
        puVar9 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&stack0xfffffffffffffe10);
        TableFileName((string *)&stack0xfffffffffffffe18,
                      (string *)
                      &(edit->new_files_).
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,*puVar9);
        Slice::Slice(&local_1c8,(string *)&stack0xfffffffffffffe18);
        Status::Corruption((Status *)this,&local_1b8,&local_1c8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
      }
LAB_00119f70:
      local_5c = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 &number);
    }
    else {
      Status::Status((Status *)this,&local_38);
      local_5c = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
  }
  else {
    Status::Status((Status *)this,&local_38);
    local_5c = 1;
  }
LAB_00119f94:
  Status::~Status(&local_38);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    std::snprintf(buf, sizeof(buf), "%d missing files; e.g.",
                  static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}